

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManAreaFlow(Of_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  Gia_Obj_t *local_28;
  Gia_Obj_t *pObj;
  int Total;
  int Id;
  int i;
  int AreaUnit;
  Of_Man_t *p_local;
  
  if (p->pGia->pRefs != (int *)0x0) {
    __assert_fail("p->pGia->pRefs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                  ,0xaf,"void Of_ManAreaFlow(Of_Man_t *)");
  }
  Gia_ManCreateRefs(p->pGia);
  Of_ObjSetFlow(p,0,0);
  Total = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->pGia->vCis);
    bVar6 = false;
    if (Total < iVar3) {
      p_00 = p->pGia;
      pGVar5 = Gia_ManCi(p->pGia,Total);
      pObj._4_4_ = Gia_ObjId(p_00,pGVar5);
      bVar6 = pObj._4_4_ != 0;
    }
    if (!bVar6) break;
    Of_ObjSetFlow(p,pObj._4_4_,0);
    Total = Total + 1;
  }
  pObj._4_4_ = 0;
  while( true ) {
    bVar6 = false;
    if (pObj._4_4_ < p->pGia->nObjs) {
      local_28 = Gia_ManObj(p->pGia,pObj._4_4_);
      bVar6 = local_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar3 = Gia_ObjIsAnd(local_28);
    if (iVar3 != 0) {
      pGVar5 = Gia_ObjFanin0(local_28);
      uVar1 = pGVar5->Value;
      pGVar5 = Gia_ObjFanin1(local_28);
      uVar2 = pGVar5->Value;
      uVar4 = Gia_ObjRefNum(p->pGia,local_28);
      Of_ObjSetFlow(p,pObj._4_4_,(uVar1 + uVar2 + 1000) / uVar4);
    }
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  Total = 0;
  while( true ) {
    iVar3 = Vec_IntSize(p->pGia->vCos);
    bVar6 = false;
    if (Total < iVar3) {
      local_28 = Gia_ManCo(p->pGia,Total);
      bVar6 = local_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    Gia_ObjFanin0(local_28);
    Total = Total + 1;
  }
  if (p->pGia->pRefs != (int *)0x0) {
    free(p->pGia->pRefs);
    p->pGia->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Of_ManAreaFlow( Of_Man_t * p )
{
    int AreaUnit = 1000;
    int i, Id, Total = 0;
    Gia_Obj_t * pObj;
    assert( p->pGia->pRefs == NULL );
    Gia_ManCreateRefs( p->pGia );
    Of_ObjSetFlow( p, 0, 0 );
    Gia_ManForEachCiId( p->pGia, Id, i )
        Of_ObjSetFlow( p, Id, 0 );
    Gia_ManForEachAnd( p->pGia, pObj, Id )
        Of_ObjSetFlow( p, Id, (Gia_ObjFanin0(pObj)->Value + Gia_ObjFanin1(pObj)->Value + AreaUnit) / Gia_ObjRefNum(p->pGia, pObj) );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Total += Gia_ObjFanin0(pObj)->Value;
    ABC_FREE( p->pGia->pRefs );
    if ( 1 )
        return;
    printf( "CI = %5d.  ", Gia_ManCiNum(p->pGia) );
    printf( "CO = %5d.  ", Gia_ManCoNum(p->pGia) );
    printf( "And = %8d.  ", Gia_ManAndNum(p->pGia) );
    printf( "Area = %8d.  ", Total/AreaUnit );
    printf( "\n" );
}